

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O0

int __thiscall fw::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  int iVar1;
  ostream *poVar2;
  GLchar local_218 [8];
  GLchar infoLog [512];
  GLint success;
  ShaderProgram *this_local;
  
  (*glad_glLinkProgram)(this->_program);
  iVar1 = (*glad_glGetProgramiv)(this->_program,0x8b82,(GLint *)(infoLog + 0x1fc));
  if (infoLog._508_4_ == 0) {
    (*glad_glGetProgramInfoLog)(this->_program,0x200,(GLsizei *)0x0,local_218);
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Shader link");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,local_218);
    iVar1 = std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return iVar1;
}

Assistant:

void ShaderProgram::link() {
  glLinkProgram(_program);

  GLint success;
  GLchar infoLog[512];
  glGetProgramiv(_program, GL_LINK_STATUS, &success);
  if (!success) {
      glGetProgramInfoLog(_program, 512, NULL, infoLog);
      std::cout << "Error: Shader link" << std::endl << infoLog << std::endl;
  }
}